

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ShaderCompileStatusCase::test
          (ShaderCompileStatusCase *this)

{
  GLuint shader;
  GLuint shader_00;
  GLuint shaderFrag;
  GLuint shaderVert;
  ShaderCompileStatusCase *this_local;
  
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader,0x8b81,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b81,0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader,1,
             &Functional::(anonymous_namespace)::commonTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,1,
             &Functional::(anonymous_namespace)::commonTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader,0x8b81,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b81,1);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_FALSE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_FALSE);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_TRUE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_TRUE);

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		expectError(GL_NO_ERROR);
	}